

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

char * cc_bits_string(int bits,char *buf)

{
  char cVar1;
  int local_1c;
  int i;
  char *buf_local;
  int bits_local;
  
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    if ((bits & 1 << (4U - (char)local_1c & 0x1f)) == 0) {
      cVar1 = '-';
    }
    else {
      cVar1 = "-CNVXZ"[(long)local_1c + 1];
    }
    buf[local_1c] = cVar1;
  }
  buf[5] = '\0';
  return buf;
}

Assistant:

static char *
cc_bits_string (int bits, char *buf)
{
  int i;

  /* Generate the string. */
  for (i = 0; i < 5; i++)
    buf[i] = (bits & (1 << (4 - i))) ? "CNVXZ"[i] : '-';
  buf[5] = '\0';

  return buf;
}